

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadMeshSkeletonLink(OgreBinarySerializer *this,Mesh *mesh)

{
  string local_38;
  Mesh *local_18;
  Mesh *mesh_local;
  OgreBinarySerializer *this_local;
  
  local_18 = mesh;
  mesh_local = (Mesh *)this;
  ReadLine_abi_cxx11_(&local_38,this);
  std::__cxx11::string::operator=((string *)&local_18->skeletonRef,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void OgreBinarySerializer::ReadMeshSkeletonLink(Mesh *mesh)
{
    mesh->skeletonRef = ReadLine();
}